

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resample_filters.cpp
# Opt level: O0

float crnlib::blackman_filter(float t)

{
  double dVar1;
  double dVar2;
  undefined4 local_10;
  undefined4 local_c;
  float t_local;
  
  local_10 = t;
  if (t < 0.0) {
    local_10 = -t;
  }
  if (3.0 <= local_10) {
    local_c = 0.0;
  }
  else {
    dVar1 = sinc((double)local_10);
    dVar2 = blackman_exact_window((double)(local_10 / 3.0));
    local_c = clean(dVar1 * dVar2);
  }
  return local_c;
}

Assistant:

static float blackman_filter(float t)
    {
        if (t < 0.0f)
        {
            t = -t;
        }

        if (t < 3.0f)
        {
            //return clean(sinc(t) * blackman_window(t / 3.0f));
            return clean(sinc(t) * blackman_exact_window(t / 3.0f));
        }
        else
        {
            return 0.0f;
        }
    }